

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O1

size_t encoder_qp_read(char *buffer,size_t size,_Bool ateof,curl_mimepart *part)

{
  size_t *psVar1;
  byte bVar2;
  byte bVar3;
  undefined4 uVar4;
  char *pcVar5;
  char cVar6;
  int iVar7;
  size_t sVar8;
  undefined7 in_register_00000011;
  size_t n;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  size_t unaff_R15;
  char buf [4];
  char cStack_5d;
  undefined4 local_5c;
  size_t local_58;
  int local_4c;
  mime_encoder_state *local_48;
  char *local_40;
  size_t local_38;
  
  local_4c = (int)CONCAT71(in_register_00000011,ateof);
  local_40 = buffer;
  local_48 = &part->encstate;
  local_58 = 0;
  do {
    uVar4 = local_5c;
    uVar11 = (part->encstate).bufbeg;
    if ((part->encstate).bufend <= uVar11) goto LAB_00141351;
    bVar2 = (part->encstate).buf[uVar11];
    bVar3 = ""[bVar2];
    n = (size_t)bVar3;
    local_5c._0_2_ = CONCAT11("0123456789ABCDEF"[bVar2 >> 4],bVar2);
    local_5c._3_1_ = SUB41(uVar4,3);
    local_5c._0_3_ = CONCAT12("0123456789ABCDEF"[bVar2 & 0xf],(undefined2)local_5c);
    uVar11 = n;
    if (bVar3 == 1) {
LAB_00141257:
      if ((&cStack_5d)[uVar11] != '\n') {
        uVar10 = local_48->pos + uVar11;
        if (uVar10 == 0x4c) {
          iVar7 = qp_lookahead_eol(local_48,local_4c,n);
          if (iVar7 == -1) goto LAB_0014133a;
          if (iVar7 != 0) goto LAB_00141296;
        }
        else {
LAB_00141296:
          if (uVar10 < 0x4d) goto LAB_001412ac;
        }
        local_5c = 0xa0d3d;
        uVar11 = 3;
        n = 0;
      }
LAB_001412ac:
      pcVar5 = local_40;
      if (size < uVar11) {
        if (local_58 == 0) {
          unaff_R15 = 0xfffffffffffffffe;
        }
        cVar6 = (local_58 != 0) * '\x02' + '\x01';
      }
      else {
        local_38 = unaff_R15;
        memcpy(local_40,&local_5c,uVar11);
        local_58 = local_58 + uVar11;
        local_40 = pcVar5 + uVar11;
        sVar8 = (part->encstate).pos + uVar11;
        (part->encstate).pos = sVar8;
        cVar6 = '\0';
        sVar9 = 0;
        if (*(char *)((uVar11 - 1) + (long)&local_5c) != '\n') {
          sVar9 = sVar8;
        }
        (part->encstate).pos = sVar9;
        psVar1 = &(part->encstate).bufbeg;
        *psVar1 = *psVar1 + n;
        size = size - uVar11;
        unaff_R15 = local_38;
      }
    }
    else {
      if (bVar3 != 3) {
        if (bVar3 == 2) {
          iVar7 = qp_lookahead_eol(local_48,local_4c,1);
          if (iVar7 == -1) goto LAB_0014133a;
          if (iVar7 == 0) {
            uVar11 = 1;
          }
          else {
            local_5c = CONCAT31(local_5c._1_3_,0x3d);
            uVar11 = 3;
          }
          n = 1;
        }
        else {
LAB_00141230:
          local_5c = CONCAT31(local_5c._1_3_,0x3d);
          n = 1;
          uVar11 = 3;
        }
        goto LAB_00141257;
      }
      iVar7 = qp_lookahead_eol(local_48,local_4c,0);
      if (iVar7 != -1) {
        if (iVar7 != 1) goto LAB_00141230;
        local_5c._0_2_ = CONCAT11(10,(undefined1)local_5c);
        n = 2;
        uVar11 = 2;
        goto LAB_00141257;
      }
LAB_0014133a:
      cVar6 = '\x01';
      unaff_R15 = local_58;
    }
  } while (cVar6 == '\0');
  if (cVar6 == '\x03') {
LAB_00141351:
    unaff_R15 = local_58;
  }
  return unaff_R15;
}

Assistant:

static size_t encoder_qp_read(char *buffer, size_t size, bool ateof,
                              curl_mimepart *part)
{
  struct mime_encoder_state *st = &part->encstate;
  char *ptr = buffer;
  size_t cursize = 0;
  int softlinebreak;
  char buf[4];

  /* On all platforms, input is supposed to be ASCII compatible: for this
     reason, we use hexadecimal ASCII codes in this function rather than
     character constants that can be interpreted as non-ASCII on some
     platforms. Preserve ASCII encoding on output too. */
  while(st->bufbeg < st->bufend) {
    size_t len = 1;
    size_t consumed = 1;
    int i = st->buf[st->bufbeg];
    buf[0] = (char) i;
    buf[1] = aschex[(i >> 4) & 0xF];
    buf[2] = aschex[i & 0xF];

    switch(qp_class[st->buf[st->bufbeg] & 0xFF]) {
    case QP_OK:          /* Not a special character. */
      break;
    case QP_SP:          /* Space or tab. */
      /* Spacing must be escaped if followed by CRLF. */
      switch(qp_lookahead_eol(st, ateof, 1)) {
      case -1:          /* More input data needed. */
        return cursize;
      case 0:           /* No encoding needed. */
        break;
      default:          /* CRLF after space or tab. */
        buf[0] = '\x3D';    /* '=' */
        len = 3;
        break;
      }
      break;
    case QP_CR:         /* Carriage return. */
      /* If followed by a line-feed, output the CRLF pair.
         Else escape it. */
      switch(qp_lookahead_eol(st, ateof, 0)) {
      case -1:          /* Need more data. */
        return cursize;
      case 1:           /* CRLF found. */
        buf[len++] = '\x0A';    /* Append '\n'. */
        consumed = 2;
        break;
      default:          /* Not followed by LF: escape. */
        buf[0] = '\x3D';    /* '=' */
        len = 3;
        break;
      }
      break;
    default:            /* Character must be escaped. */
      buf[0] = '\x3D';    /* '=' */
      len = 3;
      break;
    }

    /* Be sure the encoded character fits within maximum line length. */
    if(buf[len - 1] != '\x0A') {    /* '\n' */
      softlinebreak = st->pos + len > MAX_ENCODED_LINE_LENGTH;
      if(!softlinebreak && st->pos + len == MAX_ENCODED_LINE_LENGTH) {
        /* We may use the current line only if end of data or followed by
           a CRLF. */
        switch(qp_lookahead_eol(st, ateof, consumed)) {
        case -1:        /* Need more data. */
          return cursize;
        case 0:         /* Not followed by a CRLF. */
          softlinebreak = 1;
          break;
        }
      }
      if(softlinebreak) {
        strcpy(buf, "\x3D\x0D\x0A");    /* "=\r\n" */
        len = 3;
        consumed = 0;
      }
    }

    /* If the output buffer would overflow, do not store. */
    if(len > size) {
      if(!cursize)
        return STOP_FILLING;
      break;
    }

    /* Append to output buffer. */
    memcpy(ptr, buf, len);
    cursize += len;
    ptr += len;
    size -= len;
    st->pos += len;
    if(buf[len - 1] == '\x0A')    /* '\n' */
      st->pos = 0;
    st->bufbeg += consumed;
  }

  return cursize;
}